

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O3

void __thiscall
piece_data::do_quiet(piece_data *this,Color *c,Piece *p,Square *f,Square *t,info *ifo)

{
  unsigned_long *puVar1;
  Square SVar2;
  Square SVar3;
  Color CVar4;
  Piece PVar5;
  int iVar6;
  ulong uVar7;
  U64 UVar8;
  ulong uVar9;
  
  SVar2 = *f;
  SVar3 = *t;
  uVar9 = (&bitboards::squares)[SVar3];
  uVar7 = (&bitboards::squares)[SVar2];
  CVar4 = *c;
  PVar5 = *p;
  iVar6 = (this->piece_idx)._M_elems[CVar4]._M_elems[PVar5]._M_elems[SVar2];
  (this->piece_idx)._M_elems[CVar4]._M_elems[PVar5]._M_elems[SVar2] = 0;
  (this->piece_idx)._M_elems[CVar4]._M_elems[PVar5]._M_elems[SVar3] = iVar6;
  puVar1 = (this->bycolor)._M_elems + CVar4;
  *puVar1 = *puVar1 ^ (uVar9 | uVar7);
  puVar1 = (this->bitmap)._M_elems[CVar4]._M_elems + PVar5;
  *puVar1 = *puVar1 ^ (uVar9 | uVar7);
  (this->square_of)._M_elems[CVar4]._M_elems[PVar5]._M_elems[iVar6] = SVar3;
  SVar2 = *f;
  (this->color_on)._M_elems[SVar2] = no_color;
  (this->color_on)._M_elems[SVar3] = *c;
  (this->piece_on)._M_elems[SVar3] = PVar5;
  (this->piece_on)._M_elems[SVar2] = no_piece;
  uVar9 = ifo->key;
  UVar8 = zobrist::piece(f,c,p);
  uVar9 = UVar8 ^ uVar9;
  ifo->key = uVar9;
  UVar8 = zobrist::piece(t,c,p);
  ifo->key = UVar8 ^ uVar9;
  uVar9 = ifo->repkey;
  UVar8 = zobrist::piece(f,c,p);
  uVar9 = UVar8 ^ uVar9;
  ifo->repkey = uVar9;
  UVar8 = zobrist::piece(t,c,p);
  ifo->repkey = UVar8 ^ uVar9;
  if (*p == pawn) {
    uVar9 = ifo->pawnkey;
    UVar8 = zobrist::piece(f,c,p);
    uVar9 = UVar8 ^ uVar9;
    ifo->pawnkey = uVar9;
    UVar8 = zobrist::piece(t,c,p);
    ifo->pawnkey = UVar8 ^ uVar9;
  }
  return;
}

Assistant:

inline void piece_data::do_quiet(const Color& c, const Piece& p,
	const Square& f, const Square& t, info& ifo) {

	// bitmaps
	U64 fto = bitboards::squares[f] | bitboards::squares[t];

	int idx = piece_idx[c][p][f];
	piece_idx[c][p][f] = 0;
	piece_idx[c][p][t] = idx;

	bycolor[c] ^= fto;
	bitmap[c][p] ^= fto;

	square_of[c][p][idx] = t;
	color_on[f] = no_color;
	color_on[t] = c;

	piece_on[t] = p;
	piece_on[f] = no_piece;

	ifo.key = ifo.key ^ zobrist::piece(f, c, p);
	ifo.key = ifo.key ^ zobrist::piece(t, c, p);

	ifo.repkey = ifo.repkey ^ zobrist::piece(f, c, p);
	ifo.repkey = ifo.repkey ^ zobrist::piece(t, c, p);

	if (p == Piece::pawn) {
		ifo.pawnkey = ifo.pawnkey ^ zobrist::piece(f, c, p);
		ifo.pawnkey = ifo.pawnkey ^ zobrist::piece(t, c, p);
	}
}